

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImGuiWindow *pIVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  char *pcVar4;
  ImVector<ImGuiColorMod> *in_RSI;
  code *in_RDI;
  bool bVar5;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiCol in_stack_ffffffffffffffbc;
  ImVector<ImGuiColorMod> *in_stack_ffffffffffffffc0;
  code *in_stack_ffffffffffffffd0;
  
  pIVar3 = GImGui;
  while( true ) {
    if ((pIVar3->CurrentWindowStack).Size < 1) {
      return;
    }
    while( true ) {
      bVar5 = false;
      if ((pIVar3->CurrentTable != (ImGuiTable *)0x0) &&
         (bVar5 = true, pIVar3->CurrentTable->OuterWindow != pIVar3->CurrentWindow)) {
        bVar5 = pIVar3->CurrentTable->InnerWindow == pIVar3->CurrentWindow;
      }
      if (!bVar5) break;
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing EndTable() in \'%s\'",
                  pIVar3->CurrentTable->OuterWindow->Name);
      }
      EndTable();
    }
    pIVar1 = pIVar3->CurrentWindow;
    if (pIVar1 == (ImGuiWindow *)0x0) break;
    while (pIVar3->CurrentTabBar != (ImGuiTabBar *)0x0) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing EndTabBar() in \'%s\'",pIVar1->Name);
      }
      EndTabBar();
    }
    while (0 < (pIVar1->DC).TreeDepth) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing TreePop() in \'%s\'",pIVar1->Name);
      }
      TreePop();
    }
    while ((int)(pIVar1->DC).StackSizesOnBegin.SizeOfGroupStack < (pIVar3->GroupStack).Size) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing EndGroup() in \'%s\'",pIVar1->Name);
      }
      EndGroup();
    }
    while (1 < (pIVar1->IDStack).Size) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing PopID() in \'%s\'",pIVar1->Name);
      }
      PopID();
    }
    while ((int)(pIVar1->DC).StackSizesOnBegin.SizeOfColorStack < (pIVar3->ColorStack).Size) {
      if (in_RDI != (code *)0x0) {
        pcVar2 = pIVar1->Name;
        in_stack_ffffffffffffffc0 = in_RSI;
        in_stack_ffffffffffffffd0 = in_RDI;
        ImVector<ImGuiColorMod>::back(in_RSI);
        pcVar4 = GetStyleColorName(in_stack_ffffffffffffffbc);
        (*in_stack_ffffffffffffffd0)
                  (in_stack_ffffffffffffffc0,
                   "Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",pcVar2,pcVar4)
        ;
      }
      PopStyleColor((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    }
    while ((int)(pIVar1->DC).StackSizesOnBegin.SizeOfStyleVarStack < (pIVar3->StyleVarStack).Size) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing PopStyleVar() in \'%s\'",pIVar1->Name);
      }
      PopStyleVar((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    }
    while ((int)(pIVar1->DC).StackSizesOnBegin.SizeOfFocusScopeStack <
           (pIVar3->FocusScopeStack).Size) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing PopFocusScope() in \'%s\'",pIVar1->Name);
      }
      PopFocusScope();
    }
    if ((pIVar3->CurrentWindowStack).Size == 1) {
      if ((pIVar3->CurrentWindow->IsFallbackWindow & 1U) != 0) {
        return;
      }
      __assert_fail("g.CurrentWindow->IsFallbackWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1c01,"void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback, void *)");
    }
    if (pIVar1 != pIVar3->CurrentWindow) {
      __assert_fail("window == g.CurrentWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1c04,"void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback, void *)");
    }
    if ((pIVar1->Flags & 0x1000000U) == 0) {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing End() for \'%s\'",pIVar1->Name);
      }
      End();
    }
    else {
      if (in_RDI != (code *)0x0) {
        (*in_RDI)(in_RSI,"Recovered from missing EndChild() for \'%s\'",pIVar1->Name);
      }
      EndChild();
    }
  }
  __assert_fail("window != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1bdb,"void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback, void *)");
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0)
    {
#ifdef IMGUI_HAS_TABLE
        while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
            EndTable();
        }
#endif
        ImGuiWindow* window = g.CurrentWindow;
        IM_ASSERT(window != NULL);
        while (g.CurrentTabBar != NULL) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
            EndTabBar();
        }
        while (window->DC.TreeDepth > 0)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
            TreePop();
        }
        while (g.GroupStack.Size > window->DC.StackSizesOnBegin.SizeOfGroupStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
            EndGroup();
        }
        while (window->IDStack.Size > 1)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
            PopID();
        }
        while (g.ColorStack.Size > window->DC.StackSizesOnBegin.SizeOfColorStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
            PopStyleColor();
        }
        while (g.StyleVarStack.Size > window->DC.StackSizesOnBegin.SizeOfStyleVarStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
            PopStyleVar();
        }
        while (g.FocusScopeStack.Size > window->DC.StackSizesOnBegin.SizeOfFocusScopeStack)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
            PopFocusScope();
        }
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(g.CurrentWindow->IsFallbackWindow);
            break;
        }
        IM_ASSERT(window == g.CurrentWindow);
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}